

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeightVectorPhrase.cpp
# Opt level: O1

double __thiscall wv::WeightVectorPhrase::calcDistance(WeightVectorPhrase *this,Point *p)

{
  char *pcVar1;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  int iVar2;
  uint uVar3;
  const_iterator cVar4;
  const_iterator cVar5;
  undefined8 *puVar6;
  uint uVar7;
  ulong uVar8;
  key_type local_60;
  double local_40;
  uint local_34;
  
  if (p == (Point *)0x0) {
    __cxa_bad_typeid();
  }
  else {
    pcVar1 = *(char **)((this->super_AbstractWeightVector)._vptr_AbstractWeightVector[-1] + 8);
    iVar2 = strcmp(*(char **)(p->_vptr_AbstractWeightVector[-1] + 8) +
                   (**(char **)(p->_vptr_AbstractWeightVector[-1] + 8) == '*'),
                   pcVar1 + (*pcVar1 == '*'));
    if (iVar2 == 0) {
      iVar2 = (*(this->super_AbstractWeightVector)._vptr_AbstractWeightVector[3])(this);
      if (iVar2 == 0) {
        local_40 = 1.0;
      }
      else {
        local_40 = 0.0;
        local_34 = 0;
        do {
          iVar2 = (*p->_vptr_AbstractWeightVector[3])(p);
          if (iVar2 != 0) {
            uVar8 = 0;
            do {
              this_00 = &this->m_Distances->_M_h;
              (*(this->super_AbstractWeightVector)._vptr_AbstractWeightVector[2])
                        (&local_60,this,(ulong)local_34);
              cVar4 = std::
                      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::find(this_00,&local_60);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_60._M_dataplus._M_p != &local_60.field_2) {
                operator_delete(local_60._M_dataplus._M_p);
              }
              if (cVar4.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>,_true>
                  ._M_cur != (__node_type *)0x0) {
                (*p->_vptr_AbstractWeightVector[2])(&local_60,p,uVar8);
                cVar5 = std::
                        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                *)((long)cVar4.
                                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>,_true>
                                         ._M_cur + 0x28),&local_60);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_60._M_dataplus._M_p != &local_60.field_2) {
                  operator_delete(local_60._M_dataplus._M_p);
                }
                if (cVar5.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
                    ._M_cur != (__node_type *)0x0) {
                  local_40 = local_40 +
                             *(double *)
                              ((long)cVar5.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
                                     ._M_cur + 0x28);
                }
              }
              uVar7 = (int)uVar8 + 1;
              uVar8 = (ulong)uVar7;
              uVar3 = (*p->_vptr_AbstractWeightVector[3])(p);
            } while (uVar7 < uVar3);
          }
          uVar7 = local_34 + 1;
          uVar3 = (*(this->super_AbstractWeightVector)._vptr_AbstractWeightVector[3])(this);
          local_34 = uVar7;
        } while (uVar7 < uVar3);
        local_40 = local_40 + 1.0;
      }
      return 5.0 / local_40;
    }
  }
  puVar6 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar6 = std::__cxx11::string::_M_replace;
  __cxa_throw(puVar6,&std::bad_typeid::typeinfo,std::bad_typeid::~bad_typeid);
}

Assistant:

double WeightVectorPhrase::calcDistance(const Point* p) const
    {
        if (strcmp(typeid(*p).name(), typeid(*this).name()) != 0)
            throw std::bad_typeid();
        
        double metric = 0;
        for (uint32_t i = 0; i < getNumDimensions(); i++)
        {
            for (uint32_t j = 0; j < p->getNumDimensions(); j++)
            {
                std::unordered_map<std::string, std::unordered_map<std::string, double>>::const_iterator it_ext = m_Distances.find(getConcreteCoord(i));
                if (it_ext != m_Distances.end())
                {
                    std::unordered_map<std::string, double>::const_iterator it_int = it_ext->second.find(p->getConcreteCoord(j));
                    if (it_int != it_ext->second.end())
                        metric += it_int->second;
                }
            }
        }
        
        return 5.0 / (metric + 1.0); 
    }